

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)46,_(unsigned_short)29>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = *in;
  uVar1 = puVar3[2];
  out[0x1d] = (ulong)(uVar1 & 0xf) << 0x2a | (ulong)puVar3[1] << 10 | (ulong)(*puVar3 >> 0x16);
  *in = puVar3 + 3;
  uVar2 = puVar3[3];
  out[0x1e] = (ulong)(uVar2 & 0x3ffff) << 0x1c | (ulong)(uVar1 >> 4);
  out[0x1f] = (ulong)puVar3[4] << 0xe | (ulong)(uVar2 >> 0x12);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}